

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyfiledialogs.c
# Opt level: O3

int tryCommand(char *aCommand)

{
  FILE *__stream;
  char *pcVar1;
  char lBuff [1024];
  char acStack_418 [1032];
  
  __stream = popen(aCommand,"r");
  pcVar1 = fgets(acStack_418,0x400,__stream);
  pclose(__stream);
  return (int)(pcVar1 == (char *)0x0);
}

Assistant:

static int tryCommand( char const * const aCommand )
{
        char lBuff [MAX_PATH_OR_CMD] ;
        FILE * lIn ;

        lIn = popen( aCommand , "r" ) ;
        if ( fgets( lBuff , sizeof( lBuff ) , lIn ) == NULL )
        {       /* present */
                pclose( lIn ) ;
                return 1 ;
        }
        else
        {
                pclose( lIn ) ;
                return 0 ;
        }

}